

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void term_clrsb(Terminal *term)

{
  void *ptr;
  termline *line_00;
  wchar_t local_1c;
  wchar_t i;
  uchar *line;
  Terminal *term_local;
  
  term->disptop = L'\0';
  while( true ) {
    ptr = delpos234(term->scrollback,0);
    if (ptr == (void *)0x0) break;
    safefree(ptr);
  }
  for (local_1c = L'\0'; local_1c < term->rows; local_1c = local_1c + L'\x01') {
    line_00 = lineptr(term,local_1c,L'ۭ',L'\x01');
    check_line_size(term,line_00);
  }
  if ((term->selstate != LEXICOGRAPHIC) && ((term->selstart).y < L'\0')) {
    deselect(term);
  }
  term->tempsblines = L'\0';
  term->alt_sblines = L'\0';
  term->win_scrollbar_update_pending = true;
  term_schedule_update(term);
  return;
}

Assistant:

void term_clrsb(Terminal *term)
{
    unsigned char *line;
    int i;

    /*
     * Scroll forward to the current screen, if we were back in the
     * scrollback somewhere until now.
     */
    term->disptop = 0;

    /*
     * Clear the actual scrollback.
     */
    while ((line = delpos234(term->scrollback, 0)) != NULL) {
        sfree(line);            /* this is compressed data, not a termline */
    }

    /*
     * When clearing the scrollback, we also truncate any termlines on
     * the current screen which have remembered data from a previous
     * larger window size. Rationale: clearing the scrollback is
     * sometimes done to protect privacy, so the user intention is
     * specifically that we should not retain evidence of what
     * previously happened in the terminal, and that ought to include
     * evidence to the right as well as evidence above.
     */
    for (i = 0; i < term->rows; i++)
        check_line_size(term, scrlineptr(i));

    /*
     * That operation has invalidated the selection, if it overlapped
     * the scrollback at all.
     */
    if (term->selstate != NO_SELECTION && term->selstart.y < 0)
        deselect(term);

    /*
     * There are now no lines of real scrollback which can be pulled
     * back into the screen by a resize, and no lines of the alternate
     * screen which should be displayed as if part of the scrollback.
     */
    term->tempsblines = 0;
    term->alt_sblines = 0;

    /*
     * The scrollbar will need updating to reflect the new state of
     * the world.
     */
    term->win_scrollbar_update_pending = true;
    term_schedule_update(term);
}